

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *config)

{
  allocator<char> local_49;
  string local_48;
  ReporterConfig *local_18;
  ReporterConfig *config_local;
  JunitReporter *this_local;
  
  local_18 = config;
  config_local = (ReporterConfig *)this;
  SharedImpl<Catch::IReporter>::SharedImpl(&this->super_SharedImpl<Catch::IReporter>);
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__JunitReporter_0029d5d8;
  ReporterConfig::ReporterConfig(&this->m_config,local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"AllTests",&local_49);
  Stats::Stats(&this->m_testSuiteStats,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this->m_currentStats = &this->m_testSuiteStats;
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::vector
            (&this->m_statsForSuites);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdOut);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdErr);
  return;
}

Assistant:

JunitReporter( const ReporterConfig& config )
        :   m_config( config ),
            m_testSuiteStats( "AllTests" ),
            m_currentStats( &m_testSuiteStats )
        {}